

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O2

void cpp_bindgen::_impl::
     add_entity<cpp_bindgen::_impl::fortran_wrapper_traits,void(double(&)[2][2],double),char_const*&,char_const*&>
               (char *name,char **params,char **params_1)

{
  entities *this;
  generator_t gStack_58;
  _Bind<void_(*(std::_Placeholder<1>,_const_char_*,_const_char_*))(std::basic_ostream<char,_std::char_traits<char>_>_&,_const_char_*,_const_char_*)>
  local_38;
  
  this = get_entities<cpp_bindgen::_impl::fortran_wrapper_traits>();
  local_38._M_f = fortran_wrapper_traits::generate_entity<void(double(&)[2][2],double)>;
  local_38._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
  super__Head_base<2UL,_const_char_*,_false>._M_head_impl =
       (_Head_base<2UL,_const_char_*,_false>)*params_1;
  local_38._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = *params;
  std::function<void(std::ostream&,char_const*)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,char_const*,char_const*))(std::ostream&,char_const*,char_const*)>,void>
            ((function<void(std::ostream&,char_const*)> *)&gStack_58,&local_38);
  entities::add(this,name,&gStack_58);
  std::_Function_base::~_Function_base(&gStack_58.super__Function_base);
  return;
}

Assistant:

void add_entity(const char *name, Params &&... params) {
            get_entities<Traits>().add(name,
                std::bind(Traits::template generate_entity<Signature>,
                    std::placeholders::_1,
                    std::forward<Params>(params)...));
        }